

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_format(lua_State *L)

{
  byte *__src;
  ushort *puVar1;
  byte bVar2;
  int iVar3;
  int arg;
  int iVar4;
  byte *pbVar5;
  char *pcVar6;
  void *pvVar7;
  ushort **ppuVar8;
  lua_Integer lVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  ulong uVar14;
  lconv *plVar15;
  undefined1 *puVar16;
  uint uVar17;
  size_t sVar18;
  size_t sVar19;
  byte *pbVar20;
  long lVar21;
  byte *pbVar22;
  lua_Number lVar23;
  size_t l;
  int local_208c;
  char form [32];
  size_t local_2060;
  size_t sfl;
  luaL_Buffer b;
  
  iVar3 = lua_gettop(L);
  pbVar5 = (byte *)luaL_checklstring(L,1,&sfl);
  pbVar22 = pbVar5 + sfl;
  luaL_buffinit(L,&b);
  iVar4 = 1;
  do {
    while( true ) {
      while( true ) {
        if (pbVar22 <= pbVar5) {
          luaL_pushresult(&b);
          return 1;
        }
        bVar2 = *pbVar5;
        if (bVar2 == 0x25) break;
        if (b.size <= b.n) {
          luaL_prepbuffsize(&b,1);
          bVar2 = *pbVar5;
        }
        pbVar5 = pbVar5 + 1;
        b.b[b.n] = bVar2;
        b.n = b.n + 1;
      }
      __src = pbVar5 + 1;
      if (pbVar5[1] != 0x25) break;
      bVar2 = 0x25;
      if (b.size <= b.n) {
        luaL_prepbuffsize(&b,1);
        bVar2 = *__src;
      }
      pbVar5 = pbVar5 + 2;
      b.b[b.n] = bVar2;
      b.n = b.n + 1;
    }
    pcVar6 = luaL_prepbuffsize(&b,0x1ac);
    arg = iVar4 + 1;
    local_208c = iVar3;
    if (iVar3 <= iVar4) {
      luaL_argerror(L,arg,"no value");
    }
    lVar21 = 3;
    pbVar20 = __src;
    while( true ) {
      uVar17 = (uint)(char)*pbVar20;
      uVar14 = (ulong)uVar17;
      if ((uVar17 == 0) || (pvVar7 = memchr("-+ #0",uVar17,6), pvVar7 == (void *)0x0)) break;
      pbVar20 = pbVar20 + 1;
      lVar21 = lVar21 + 1;
    }
    if (5 < lVar21 - 3U) {
      luaL_error(L,"invalid format (repeated flags)");
      uVar14 = (ulong)*pbVar20;
    }
    ppuVar8 = __ctype_b_loc();
    iVar3 = local_208c;
    puVar1 = *ppuVar8;
    uVar14 = (ulong)(puVar1[uVar14 & 0xff] >> 0xb & 1);
    lVar21 = (puVar1[pbVar20[uVar14]] >> 0xb & 1) + uVar14;
    bVar2 = pbVar20[lVar21];
    if (bVar2 == 0x2e) {
      pbVar5 = pbVar20 + lVar21 + 2;
      if ((*(byte *)((long)puVar1 + (ulong)pbVar20[lVar21 + 1] * 2 + 1) & 8) == 0) {
        pbVar5 = pbVar20 + lVar21 + 1;
      }
      pbVar5 = pbVar5 + ((puVar1[*pbVar5] >> 0xb & 1) != 0);
      bVar2 = *pbVar5;
    }
    else {
      pbVar5 = pbVar20 + lVar21;
    }
    if ((*(byte *)((long)puVar1 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
      luaL_error(L,"invalid format (width or precision too long)");
    }
    form[0] = '%';
    memcpy(form + 1,__src,(size_t)(pbVar5 + (1 - (long)__src)));
    pbVar5[(long)(form + (2 - (long)__src))] = 0;
    bVar2 = *pbVar5;
    switch(bVar2) {
    case 0x62:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_001283c5_caseD_62:
      iVar3 = luaL_error(L,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)(char)bVar2);
      return iVar3;
    case 99:
      uVar14 = luaL_checkinteger(L,arg);
      iVar4 = snprintf(pcVar6,0x1ac,form,uVar14 & 0xffffffff);
      break;
    case 100:
    case 0x69:
    case 0x6f:
    case 0x75:
    case 0x78:
switchD_001283c5_caseD_64:
      lVar9 = luaL_checkinteger(L,arg);
      addlenmod(form,"ll");
      iVar4 = snprintf(pcVar6,0x1ac,form,lVar9);
      break;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_001283c5_caseD_65:
      lVar23 = luaL_checknumber(L,arg);
      addlenmod(form,"");
      goto LAB_00128489;
    case 0x71:
      uVar17 = lua_type(L,arg);
      if (1 < uVar17) {
        if (uVar17 == 3) {
          pcVar6 = luaL_prepbuffsize(&b,0x1ac);
          iVar4 = lua_isinteger(L,arg);
          if (iVar4 == 0) {
            lua_tonumberx(L,arg,(int *)0x0);
            iVar4 = snprintf(pcVar6,0x1ac,"%a");
            sVar12 = (size_t)iVar4;
            pvVar7 = memchr(pcVar6,0x2e,sVar12);
            if (pvVar7 == (void *)0x0) {
              plVar15 = localeconv();
              puVar16 = (undefined1 *)memchr(pcVar6,(int)*plVar15->decimal_point,sVar12);
              if (puVar16 != (undefined1 *)0x0) {
                *puVar16 = 0x2e;
              }
            }
          }
          else {
            lVar9 = lua_tointegerx(L,arg,(int *)0x0);
            iVar4 = snprintf(pcVar6,0x1ac,"%lld",lVar9);
            sVar12 = (size_t)iVar4;
          }
          b.n = b.n + sVar12;
        }
        else if (uVar17 == 4) {
          pcVar6 = lua_tolstring(L,arg,&local_2060);
          sVar19 = local_2060;
          if (b.size <= b.n) {
            luaL_prepbuffsize(&b,1);
          }
          b.b[b.n] = '\"';
          b.n = b.n + 1;
          for (sVar18 = 0; sVar19 != sVar18; sVar18 = sVar18 + 1) {
            bVar2 = pcVar6[sVar18];
            if ((((ulong)bVar2 == 10) || (bVar2 == 0x5c)) || (bVar2 == 0x22)) {
              sVar10 = b.n;
              if (b.size <= b.n) {
                luaL_prepbuffsize(&b,1);
                sVar10 = b.n;
              }
              b.n = sVar10 + 1;
              b.b[sVar10] = '\\';
              if (b.size <= b.n) {
                luaL_prepbuffsize(&b,1);
              }
              b.b[b.n] = pcVar6[sVar18];
              b.n = b.n + 1;
            }
            else if (((*ppuVar8)[bVar2] & 2) == 0) {
              if (b.size <= b.n) {
                luaL_prepbuffsize(&b,1);
                bVar2 = pcVar6[sVar18];
              }
              b.b[b.n] = bVar2;
              b.n = b.n + 1;
            }
            else {
              pcVar11 = "\\%d";
              if (((*ppuVar8)[(byte)pcVar6[sVar18 + 1]] >> 0xb & 1) != 0) {
                pcVar11 = "\\%03d";
              }
              snprintf((char *)&l,10,pcVar11);
              luaL_addstring(&b,(char *)&l);
            }
          }
          if (b.size <= b.n) {
            luaL_prepbuffsize(&b,1);
          }
          b.b[b.n] = '\"';
          b.n = b.n + 1;
        }
        else {
          luaL_argerror(L,arg,"value has no literal form");
        }
        goto LAB_001287fe;
      }
      iVar4 = 0;
      luaL_tolstring(L,arg,(size_t *)0x0);
      luaL_addvalue(&b);
      break;
    case 0x73:
      pcVar11 = luaL_tolstring(L,arg,&l);
      sVar19 = l;
      if (form[2] != '\0') {
        sVar12 = strlen(pcVar11);
        if (sVar19 != sVar12) {
          luaL_argerror(L,arg,"string contains zeros");
          sVar19 = l;
        }
        pcVar13 = strchr(form,0x2e);
        if ((pcVar13 != (char *)0x0) || (sVar19 < 100)) {
          iVar4 = snprintf(pcVar6,0x1ac,form,pcVar11);
          lua_settop(L,-2);
          break;
        }
      }
      luaL_addvalue(&b);
LAB_001287fe:
      iVar4 = 0;
      break;
    default:
      if (bVar2 != 0x41) {
        if ((bVar2 == 0x45) || (bVar2 == 0x47)) goto switchD_001283c5_caseD_65;
        if (bVar2 != 0x58) goto switchD_001283c5_caseD_62;
        goto switchD_001283c5_caseD_64;
      }
    case 0x61:
      addlenmod(form,"");
      lVar23 = luaL_checknumber(L,arg);
LAB_00128489:
      iVar4 = snprintf(pcVar6,0x1ac,form,lVar23);
    }
    pbVar5 = pbVar5 + 1;
    b.n = b.n + (long)iVar4;
    iVar4 = arg;
  } while( true );
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      int maxitem = MAX_ITEM;
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put formatted item */
      int nb = 0;  /* number of bytes in added item */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
        case 'o': case 'u': case 'x': case 'X': {
          lua_Integer n = luaL_checkinteger(L, arg);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            if (!strchr(form, '.') && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(nb < maxitem);
      luaL_addsize(&b, nb);
    }
  }
  luaL_pushresult(&b);
  return 1;
}